

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<bool_(*)(void_**)>::remove(QList<bool_(*)(void_**)> *this,char *__filename)

{
  QList<bool_(*)(void_**)> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  _func_bool_void_ptr_ptr **in_stack_00000018;
  QPodArrayOps<bool_(*)(void_**)> *in_stack_00000020;
  QArrayDataPointer<bool_(*)(void_**)> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<bool_(*)(void_**)>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<bool_(*)(void_**)>::operator->(&this->d);
    QArrayDataPointer<bool_(*)(void_**)>::operator->(&this->d);
    QArrayDataPointer<bool_(*)(void_**)>::begin((QArrayDataPointer<bool_(*)(void_**)> *)0x2380c9);
    QtPrivate::QPodArrayOps<bool_(*)(void_**)>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}